

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O3

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
::select_variables(solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
                   *this,int r_size,int bkmin,int bkmax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  
  iVar1 = bkmin;
  if (r_size < bkmin) {
    iVar1 = r_size;
  }
  iVar2 = iVar1;
  if (bkmin != bkmax) {
    iVar3 = bkmax;
    if (r_size < bkmax) {
      iVar3 = r_size;
    }
    iVar2 = iVar3;
    if (iVar1 <= bkmax) {
      if (bkmin < r_size) {
        r_size = bkmin;
      }
      iVar4 = iVar1;
      if (iVar1 < iVar3) {
        iVar4 = iVar3;
      }
      iVar4 = r_size + iVar4;
      lVar5 = (long)r_size << 4;
      do {
        dVar8 = *(double *)
                 ((long)&((this->R)._M_t.
                          super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_false>
                         ._M_head_impl)->value + lVar5);
        bVar7 = dVar8 == 0.0;
        bVar6 = dVar8 < 0.0;
        if ((bVar7) && (!NAN(dVar8))) {
          dVar8 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (this->rng);
          bVar7 = dVar8 == 0.5;
          bVar6 = 0.5 < dVar8;
        }
        iVar2 = r_size;
        if (!bVar6 && !bVar7) break;
        r_size = r_size + 1;
        lVar5 = lVar5 + 0x10;
        iVar2 = iVar3;
      } while ((iVar4 - iVar1) + 1 != r_size);
    }
  }
  return iVar2 + -1;
}

Assistant:

int select_variables(const int r_size, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin, r_size) - 1;

        bkmin = std::min(bkmin, r_size);
        bkmax = std::min(bkmax, r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }